

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

String __thiscall testing::internal::FlagToEnvVar(internal *this,char *flag)

{
  size_t sVar1;
  Message *pMVar2;
  size_t sVar3;
  char *pcVar4;
  size_t extraout_RDX;
  String SVar5;
  undefined7 in_stack_ffffffffffffff70;
  char in_stack_ffffffffffffff77;
  Message *in_stack_ffffffffffffff80;
  char local_51;
  size_t local_50;
  size_t i;
  Message env_var;
  Message local_30;
  undefined1 local_28 [8];
  String full_flag;
  char *flag_local;
  
  full_flag.length_ = (size_t)flag;
  Message::Message(in_stack_ffffffffffffff80);
  pMVar2 = Message::operator<<(&local_30,(char (*) [7])"gtest_");
  pMVar2 = Message::operator<<(pMVar2,(char **)&full_flag.length_);
  Message::GetString((Message *)local_28);
  Message::~Message((Message *)0x12afec);
  Message::Message(pMVar2);
  local_50 = 0;
  while( true ) {
    sVar1 = local_50;
    sVar3 = String::length((String *)local_28);
    if (sVar1 == sVar3) break;
    pcVar4 = String::c_str((String *)local_28);
    in_stack_ffffffffffffff77 = ToUpper(pcVar4[local_50]);
    local_51 = in_stack_ffffffffffffff77;
    Message::operator<<((Message *)&i,&local_51);
    local_50 = local_50 + 1;
  }
  Message::GetString((Message *)this);
  Message::~Message((Message *)0x12b0ba);
  String::~String((String *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70));
  SVar5.length_ = extraout_RDX;
  SVar5.c_str_ = (char *)this;
  return SVar5;
}

Assistant:

static String FlagToEnvVar(const char* flag) {
  const String full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}